

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<kj::Directory::Replacer<kj::Directory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::replaceSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  ArrayDisposer **ppAVar1;
  long lVar2;
  AtomicRefcounted *refcounted;
  _func_int **pp_Var3;
  undefined4 in_register_0000000c;
  long lVar4;
  undefined8 *puVar5;
  Replacer<kj::Directory> *extraout_RDX;
  char *pcVar6;
  Replacer<kj::Directory> *extraout_RDX_00;
  Replacer<kj::Directory> *extraout_RDX_01;
  Replacer<kj::Directory> *pRVar7;
  undefined4 in_R8D;
  Directory *ptrCopy;
  Own<kj::Directory::Replacer<kj::Directory>_> OVar8;
  StringPtr name;
  Fault f;
  undefined1 local_58 [32];
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  
  lVar4 = CONCAT44(in_register_0000000c,mode);
  puVar5 = (undefined8 *)path.parts.size_;
  name.content.ptr = path.parts.ptr;
  if (lVar4 == 1) {
    newInMemoryDirectory((kj *)local_58,(Clock *)name.content.ptr[2].content.ptr);
    pcVar6 = (char *)*puVar5;
    lVar4 = puVar5[1];
    pp_Var3 = (_func_int **)operator_new(0x48);
    if (lVar4 == 0) {
      pcVar6 = "";
    }
    local_58._24_8_ = local_58._0_8_;
    local_38.ptr = (Waiter *)local_58._8_8_;
    *(undefined4 *)(pp_Var3 + 1) = in_R8D;
    *pp_Var3 = (_func_int *)&PTR_get_0044ed68;
    *(undefined1 *)((long)pp_Var3 + 0xc) = 0;
    LOCK();
    ppAVar1 = &((name.content.ptr)->content).disposer;
    *(int *)ppAVar1 = *(int *)ppAVar1 + 1;
    UNLOCK();
    pp_Var3[2] = (_func_int *)&((name.content.ptr)->content).size_;
    pp_Var3[3] = (_func_int *)name.content.ptr;
    heapString((String *)(pp_Var3 + 4),pcVar6,lVar4 + -1 + (ulong)(lVar4 == 0));
    pp_Var3[7] = (_func_int *)local_58._24_8_;
    pp_Var3[8] = (_func_int *)local_38.ptr;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>>
          ::instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var3;
    pRVar7 = extraout_RDX;
  }
  else {
    if (lVar4 == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4a9,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      _::Debug::Fault::~Fault((Fault *)local_58);
    }
    else {
      lVar2 = puVar5[1];
      if (lVar2 == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (char *)*puVar5;
      }
      name.content.size_ = (size_t)pcVar6;
      tryGetParent((InMemoryDirectory *)local_58,name,(int)lVar2 + (uint)(lVar2 == 0));
      if ((_func_int **)local_58._8_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_58._8_8_ + 0x90))
                  (this,local_58._8_8_,puVar5 + 3,lVar4 + -1,in_R8D);
        (**(code **)(((String *)local_58._0_8_)->content).ptr)
                  (local_58._0_8_,
                   (_func_int *)(local_58._8_8_ + *(long *)(*(_func_int **)local_58._8_8_ + -0x10)))
        ;
        pRVar7 = extraout_RDX_00;
        goto LAB_003463a9;
      }
    }
    newInMemoryDirectory((kj *)local_58,(Clock *)name.content.ptr[2].content.ptr);
    pp_Var3 = (_func_int **)operator_new(0x20);
    *(undefined4 *)(pp_Var3 + 1) = 3;
    *pp_Var3 = (_func_int *)&PTR_get_0044edd8;
    pp_Var3[2] = (_func_int *)local_58._0_8_;
    pp_Var3[3] = (_func_int *)local_58._8_8_;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::
          HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>>
          ::instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var3;
    pRVar7 = extraout_RDX_01;
  }
LAB_003463a9:
  OVar8.ptr = pRVar7;
  OVar8.disposer = (Disposer *)this;
  return OVar8;
}

Assistant:

Own<Replacer<Directory>> replaceSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
    } else if (path.size() == 1) {
      // don't need lock just to read the clock ref
      return heap<ReplacerImpl<Directory>>(*this, path[0],
          newInMemoryDirectory(impl.getWithoutLock().clock), mode);
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->replaceSubdir(path.slice(1, path.size()), mode);
      }
    }
    return heap<BrokenReplacer<Directory>>(newInMemoryDirectory(impl.getWithoutLock().clock));
  }